

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O0

void __thiscall Minisat::SimpSolver::relocAll(SimpSolver *this,ClauseAllocator *to)

{
  int iVar1;
  int iVar2;
  uint32_t uVar3;
  vec<unsigned_int> *this_00;
  Clause *this_01;
  Queue<unsigned_int> *in_RSI;
  CRef *in_RDI;
  ClauseAllocator *unaff_retaddr;
  CRef cr;
  int i_1;
  int j;
  vec<unsigned_int> *cs;
  int i;
  undefined4 in_stack_ffffffffffffffa8;
  Ref in_stack_ffffffffffffffac;
  OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted>
  *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int local_28;
  int local_24;
  uint in_stack_ffffffffffffffec;
  uint uVar4;
  CRef *cr_00;
  
  if ((in_RDI[0x50c] & 1) != 0) {
    cr_00 = in_RDI;
    OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted>::cleanAll
              ((OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    iVar1 = OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted>::size
                      ((OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted>
                        *)0x15e768);
    iVar2 = Solver::nVars((Solver *)0x15e776);
    if (iVar2 <= iVar1) {
      uVar4 = 0;
      while (in_stack_ffffffffffffffec = uVar4, iVar1 = Solver::nVars((Solver *)0x15e79e),
            (int)uVar4 < iVar1) {
        this_00 = OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted>::
                  operator[](in_stack_ffffffffffffffb0,
                             (int *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
        for (local_24 = 0; iVar1 = vec<unsigned_int>::size(this_00), local_24 < iVar1;
            local_24 = local_24 + 1) {
          in_stack_ffffffffffffffb0 =
               (OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted> *)
               (in_RDI + 0x142);
          vec<unsigned_int>::operator[](this_00,local_24);
          ClauseAllocator::reloc(unaff_retaddr,cr_00,(ClauseAllocator *)in_RSI);
        }
        iVar1 = vec<unsigned_int>::size(this_00);
        *(long *)(in_RDI + 0x80) = (long)iVar1 + *(long *)(in_RDI + 0x80);
        uVar4 = in_stack_ffffffffffffffec + 1;
      }
    }
    for (local_28 = Queue<unsigned_int>::size((Queue<unsigned_int> *)in_stack_ffffffffffffffb0);
        0 < local_28; local_28 = local_28 + -1) {
      Queue<unsigned_int>::peek((Queue<unsigned_int> *)0x15e88d);
      Queue<unsigned_int>::pop((Queue<unsigned_int> *)in_stack_ffffffffffffffb0);
      *(long *)(in_RDI + 0x80) = *(long *)(in_RDI + 0x80) + 1;
      this_01 = ClauseAllocator::operator[]
                          ((ClauseAllocator *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
      uVar3 = Clause::mark(this_01);
      if (uVar3 == 0) {
        ClauseAllocator::reloc(unaff_retaddr,cr_00,(ClauseAllocator *)in_RSI);
        Queue<unsigned_int>::insert(in_RSI,in_stack_ffffffffffffffec);
      }
    }
    ClauseAllocator::reloc(unaff_retaddr,cr_00,(ClauseAllocator *)in_RSI);
  }
  return;
}

Assistant:

void SimpSolver::relocAll(ClauseAllocator &to)
{
    if (!use_simplification) return;

    // All occurs lists:
    //
    occurs.cleanAll();
    if (occurs.size() >= nVars()) {
        for (int i = 0; i < nVars(); i++) {
            vec<CRef> &cs = occurs[i];
            assert((solves == 0 || cs.size() == 0) && "There should be no occurrences during solving");
            for (int j = 0; j < cs.size(); j++) ca.reloc(cs[j], to);
            statistics.simpSteps += cs.size();
        }
    }

    // Subsumption queue:
    //
    assert((solves == 0 || subsumption_queue.size() == 0) &&
           "There should be no occurrences subsumption candidates during solving");
    for (int i = subsumption_queue.size(); i > 0; i--) {
        CRef cr = subsumption_queue.peek();
        subsumption_queue.pop();
        statistics.simpSteps++;
        if (ca[cr].mark()) continue;
        ca.reloc(cr, to);
        subsumption_queue.insert(cr);
    }

    // Temporary clause:
    //
    ca.reloc(bwdsub_tmpunit, to);
}